

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_EndpointType.h
# Opt level: O0

EndpointType soul::parseEndpointType<soul::StructuralParser>(StructuralParser *tokeniser)

{
  StructuralParser *pSVar1;
  bool bVar2;
  CompileMessage local_50;
  StructuralParser *local_18;
  StructuralParser *tokeniser_local;
  
  local_18 = tokeniser;
  bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
          ::matchIfKeywordOrIdentifier(&tokeniser->super_SOULTokeniser,"value");
  if (bVar2) {
    tokeniser_local._4_4_ = value;
  }
  else {
    bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
            ::matchIfKeywordOrIdentifier(&local_18->super_SOULTokeniser,"stream");
    if (bVar2) {
      tokeniser_local._4_4_ = stream;
    }
    else {
      bVar2 = Tokeniser<soul::Keyword::Matcher,_soul::StandardOperatorMatcher,_soul::StandardIdentifierMatcher>
              ::matchIfKeywordOrIdentifier(&local_18->super_SOULTokeniser,"event");
      pSVar1 = local_18;
      if (bVar2) {
        tokeniser_local._4_4_ = event;
      }
      else {
        Errors::expectedStreamType<>();
        (*(pSVar1->super_SOULTokeniser)._vptr_Tokeniser[2])(pSVar1,&local_50);
        CompileMessage::~CompileMessage(&local_50);
        tokeniser_local._4_4_ = value;
      }
    }
  }
  return tokeniser_local._4_4_;
}

Assistant:

static EndpointType parseEndpointType (TokeniserType& tokeniser)
{
    if (tokeniser.matchIfKeywordOrIdentifier ("value"))   return EndpointType::value;
    if (tokeniser.matchIfKeywordOrIdentifier ("stream"))  return EndpointType::stream;
    if (tokeniser.matchIfKeywordOrIdentifier ("event"))   return EndpointType::event;

    tokeniser.throwError (Errors::expectedStreamType());
    return EndpointType::value;
}